

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  _IOManager_ *this;
  IO *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string path;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> param;
  ExporterT<OpenMesh::PolyMesh_ArrayKernelT<OpenMesh::DefaultTraits>_> exporter;
  Mesh mesh;
  Mesh omesh;
  long *local_4d8 [2];
  long local_4c8 [2];
  string local_4b8;
  vector<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_> local_498;
  undefined4 local_47c;
  BaseExporter local_478;
  Mesh *local_470;
  Mesh local_468;
  Mesh local_240;
  
  this_00 = (IO *)local_4d8;
  paVar1 = &local_4b8.field_2;
  local_4b8._M_string_length = 0;
  local_4b8.field_2._M_local_buf[0] = '\0';
  local_4b8._M_dataplus._M_p = (pointer)paVar1;
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Please specify the file name",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
    std::ostream::put(-0x40);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(string *)&local_4b8);
  }
  else {
    __s = argv[1];
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_4b8,0,(char *)0x0,(ulong)__s);
  }
  getOriginalMesh(&local_468,&local_4b8);
  bijectiveParameterization(&local_498,&local_468,0.0001);
  getParameterizedMesh(&local_240,&local_468,&local_498);
  local_4d8[0] = local_4c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d8,local_4b8._M_dataplus._M_p,
             local_4b8._M_dataplus._M_p + local_4b8._M_string_length);
  std::__cxx11::string::append((char *)local_4d8);
  local_478._vptr_BaseExporter = (_func_int **)&PTR__BaseExporter_001b2970;
  local_470 = &local_240;
  this = (_IOManager_ *)OpenMesh::IO::IOManager(this_00);
  local_47c = 0;
  OpenMesh::IO::_IOManager_::write
            (this,(string *)local_4d8,&local_478,(Options)(value_type)&local_47c,6);
  if (local_4d8[0] != local_4c8) {
    operator_delete(local_4d8[0],local_4c8[0] + 1);
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)&local_240);
  if (local_498.
      super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_498.
                    super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_498.
                          super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_498.
                          super__Vector_base<OpenMesh::VectorT<float,_2>,_std::allocator<OpenMesh::VectorT<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  OpenMesh::PolyConnectivity::~PolyConnectivity((PolyConnectivity *)&local_468);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_4b8._M_dataplus._M_p,
                    CONCAT71(local_4b8.field_2._M_allocated_capacity._1_7_,
                             local_4b8.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string path;
    if (argc < 2) {
        std::cout << "Please specify the file name" << std::endl;
        std::cin >> path;
    }
    else path = argv[1];
    // Import the original mesh
    auto mesh = getOriginalMesh(path);
    // parameterize the mesh    
    auto param = bijectiveParameterization(mesh);
    // export the parameterization
    auto omesh = getParameterizedMesh(mesh, param);
    OpenMesh::IO::write_mesh(omesh, path + "_param.obj");
    return 0;
}